

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::TensorLayoutNV::str_abi_cxx11_
          (string *__return_storage_ptr__,TensorLayoutNV *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream oss;
  TensorLayoutNV *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"<");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)&(this->super_Type).field_0x24);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->clamp_mode_id_);
  std::operator<<(poVar1,">");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TensorLayoutNV::str() const {
  std::ostringstream oss;
  oss << "<" << dim_id_ << ", " << clamp_mode_id_ << ">";
  return oss.str();
}